

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O0

wchar_t cmd_get_arg_direction(command *cmd,char *arg,int *dir)

{
  wchar_t wVar1;
  undefined4 local_28;
  wchar_t err;
  cmd_arg_data data;
  int *dir_local;
  char *arg_local;
  command *cmd_local;
  
  data = (cmd_arg_data)dir;
  dir_local = (int *)arg;
  arg_local = (char *)cmd;
  wVar1 = cmd_get_arg(cmd,arg,arg_DIRECTION,(cmd_arg_data *)&stack0xffffffffffffffd8);
  if (wVar1 == L'\0') {
    *(undefined4 *)data.string = local_28;
  }
  return wVar1;
}

Assistant:

int cmd_get_arg_direction(struct command *cmd, const char *arg, int *dir)
{
	union cmd_arg_data data;
	int err;

	if ((err = cmd_get_arg(cmd, arg, arg_DIRECTION, &data)) == CMD_OK)
		*dir = data.direction;

	return err;
}